

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry.cpp
# Opt level: O1

void __thiscall
duckdb::CatalogEntry::CatalogEntry
          (CatalogEntry *this,CatalogType type,Catalog *catalog,string *name_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  atomic<unsigned_long> *paVar2;
  idx_t oid;
  DatabaseManager *pDVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (name_p->_M_dataplus)._M_p;
  paVar1 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.field_2._8_8_ = *(undefined8 *)((long)&name_p->field_2 + 8);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._M_string_length = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar1;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  pDVar3 = DatabaseInstance::GetDatabaseManager(catalog->db->db);
  LOCK();
  paVar2 = &pDVar3->next_oid;
  oid = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  CatalogEntry(this,type,&local_38,oid);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

CatalogEntry::CatalogEntry(CatalogType type, Catalog &catalog, string name_p)
    : CatalogEntry(type, std::move(name_p), catalog.GetDatabase().GetDatabaseManager().NextOid()) {
}